

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::inf_or_nan_writer>
          (basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
           *this,align_spec *spec,inf_or_nan_writer *f)

{
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> __first;
  ulong uVar1;
  unsigned_long __n;
  undefined8 uVar2;
  undefined8 uVar3;
  size_t sVar4;
  undefined8 uVar5;
  char_type fill;
  __type local_50;
  
  uVar1 = 4 - (ulong)(f->sign == '\0');
  __n = spec->width_ - uVar1;
  if (spec->width_ < uVar1 || __n == 0) {
    inf_or_nan_writer::operator()
              ((inf_or_nan_writer *)f,
               (truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *)this);
    return;
  }
  fill = (char_type)spec->fill_;
  if (spec->align_ == ALIGN_CENTER) {
    uVar1 = __n >> 1 & 0x7fffffff;
    std::
    __fill_n_a1<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,unsigned_long,char>
              (&local_50,*(truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *)this,
               uVar1,&fill);
    *(ulong *)(this + 9) =
         CONCAT17((undefined1)local_50.super_truncating_iterator_base<char_*>.count_,
                  local_50.super_truncating_iterator_base<char_*>.limit_._1_7_);
    *(undefined8 *)(this + 0x11) = local_50._17_8_;
    *(char **)this = local_50.super_truncating_iterator_base<char_*>.out_;
    *(ulong *)(this + 8) =
         CONCAT71(local_50.super_truncating_iterator_base<char_*>.limit_._1_7_,
                  (undefined1)local_50.super_truncating_iterator_base<char_*>.limit_);
    inf_or_nan_writer::operator()
              ((inf_or_nan_writer *)f,
               (truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *)this);
    __n = __n - uVar1;
    uVar2 = *(undefined8 *)this;
    uVar3 = *(undefined8 *)(this + 8);
    sVar4 = *(size_t *)(this + 0x10);
    uVar5 = *(undefined8 *)(this + 0x18);
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      std::
      __fill_n_a1<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,unsigned_long,char>
                (&local_50,
                 *(truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *)this,__n,
                 &fill);
      *(ulong *)(this + 9) =
           CONCAT17((undefined1)local_50.super_truncating_iterator_base<char_*>.count_,
                    local_50.super_truncating_iterator_base<char_*>.limit_._1_7_);
      *(undefined8 *)(this + 0x11) = local_50._17_8_;
      *(char **)this = local_50.super_truncating_iterator_base<char_*>.out_;
      *(ulong *)(this + 8) =
           CONCAT71(local_50.super_truncating_iterator_base<char_*>.limit_._1_7_,
                    (undefined1)local_50.super_truncating_iterator_base<char_*>.limit_);
      inf_or_nan_writer::operator()
                ((inf_or_nan_writer *)f,
                 (truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *)this);
      return;
    }
    inf_or_nan_writer::operator()
              ((inf_or_nan_writer *)f,
               (truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *)this);
    uVar2 = *(undefined8 *)this;
    uVar3 = *(undefined8 *)(this + 8);
    sVar4 = *(size_t *)(this + 0x10);
    uVar5 = *(undefined8 *)(this + 0x18);
  }
  __first.super_truncating_iterator_base<char_*>.limit_ = uVar3;
  __first.super_truncating_iterator_base<char_*>.out_ = (char *)uVar2;
  __first.super_truncating_iterator_base<char_*>.count_ = sVar4;
  __first._24_8_ = uVar5;
  std::
  __fill_n_a1<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,unsigned_long,char>
            (&local_50,__first,__n,&fill);
  *(ulong *)(this + 9) =
       CONCAT17((undefined1)local_50.super_truncating_iterator_base<char_*>.count_,
                local_50.super_truncating_iterator_base<char_*>.limit_._1_7_);
  *(undefined8 *)(this + 0x11) = local_50._17_8_;
  *(char **)this = local_50.super_truncating_iterator_base<char_*>.out_;
  *(ulong *)(this + 8) =
       CONCAT71(local_50.super_truncating_iterator_base<char_*>.limit_._1_7_,
                (undefined1)local_50.super_truncating_iterator_base<char_*>.limit_);
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }